

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall
ImplicitDepLoader::LoadDepFile(ImplicitDepLoader *this,Edge *edge,string *path,string *err)

{
  char *path_00;
  Metrics *this_00;
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  Metric *pMVar4;
  ulong uVar5;
  pointer pSVar6;
  reference ppNVar7;
  string *str;
  reference other;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Metric *local_2f8;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_250;
  iterator local_248;
  Node **local_240;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_238;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_230;
  StringPiece *local_228;
  matches local_220;
  matches m;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
  local_210;
  iterator o;
  undefined1 local_1e8 [8];
  StringPiece opath;
  Node *first_output;
  iterator primary_out;
  uint64_t unused;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string depfile_err;
  undefined1 local_138 [8];
  DepfileParser depfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string content;
  ScopedMetric metrics_h_scoped;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *err_local;
  string *path_local;
  Edge *edge_local;
  ImplicitDepLoader *this_local;
  
  local_30 = err;
  err_local = path;
  path_local = (string *)edge;
  edge_local = (Edge *)this;
  if ((LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar3 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      local_2f8 = (Metric *)0x0;
      LoadDepFile::metrics_h_metric = local_2f8;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"depfile load",&local_51);
      pMVar4 = Metrics::NewMetric(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      LoadDepFile::metrics_h_metric = pMVar4;
    }
    __cxa_guard_release(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric
            ((ScopedMetric *)((long)&content.field_2 + 8),LoadDepFile::metrics_h_metric);
  std::__cxx11::string::string((string *)local_98);
  iVar3 = (**(code **)(*(long *)this->disk_interface_ + 0x10))
                    (this->disk_interface_,err_local,(string *)local_98,local_30);
  if (iVar3 != 0) {
    if (iVar3 == 1) {
      std::__cxx11::string::clear();
    }
    else if (iVar3 == 2) {
      std::operator+(&local_f8,"loading \'",err_local);
      std::operator+(&local_d8,&local_f8,"\': ");
      std::operator+(&local_b8,&local_d8,local_30);
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      this_local._7_1_ = 0;
      depfile._52_4_ = 1;
      goto LAB_00133a67;
    }
  }
  uVar5 = std::__cxx11::string::empty();
  pFVar1 = _stderr;
  if ((uVar5 & 1) == 0) {
    if (this->depfile_parser_options_ == (DepfileParserOptions *)0x0) {
      DepfileParserOptions::DepfileParserOptions
                ((DepfileParserOptions *)(depfile_err.field_2._M_local_buf + 0xf));
    }
    DepfileParser::DepfileParser((DepfileParser *)local_138);
    std::__cxx11::string::string((string *)local_160);
    bVar2 = DepfileParser::Parse((DepfileParser *)local_138,(string *)local_98,(string *)local_160);
    if (bVar2) {
      bVar2 = std::vector<StringPiece,_std::allocator<StringPiece>_>::empty
                        ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
      if (bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unused,
                       err_local,": no outputs declared");
        std::__cxx11::string::operator=((string *)local_30,(string *)&unused);
        std::__cxx11::string::~string((string *)&unused);
        this_local._7_1_ = 0;
      }
      else {
        first_output = (Node *)std::vector<StringPiece,_std::allocator<StringPiece>_>::begin
                                         ((vector<StringPiece,_std::allocator<StringPiece>_> *)
                                          local_138);
        pSVar6 = __gnu_cxx::
                 __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                 ::operator->((__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                               *)&first_output);
        path_00 = pSVar6->str_;
        pSVar6 = __gnu_cxx::
                 __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                 ::operator->((__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                               *)&first_output);
        CanonicalizePath(path_00,&pSVar6->len_,(uint64_t *)&primary_out);
        ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             &path_local[1]._M_string_length,0);
        opath.len_ = (size_t)*ppNVar7;
        str = Node::path_abi_cxx11_((Node *)opath.len_);
        StringPiece::StringPiece((StringPiece *)local_1e8,str);
        other = __gnu_cxx::
                __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                ::operator*((__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                             *)&first_output);
        bVar2 = StringPiece::operator!=((StringPiece *)local_1e8,other);
        pFVar1 = _stderr;
        if (bVar2) {
          if ((g_explaining & 1U) != 0) {
            uVar8 = std::__cxx11::string::c_str();
            Node::path_abi_cxx11_((Node *)opath.len_);
            uVar9 = std::__cxx11::string::c_str();
            pSVar6 = __gnu_cxx::
                     __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                     ::operator->((__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                                   *)&first_output);
            StringPiece::AsString_abi_cxx11_((string *)&o,pSVar6);
            uVar10 = std::__cxx11::string::c_str();
            fprintf(pFVar1,"ninja explain: expected depfile \'%s\' to mention \'%s\', got \'%s\'\n",
                    uVar8,uVar9,uVar10);
            std::__cxx11::string::~string((string *)&o);
          }
          this_local._7_1_ = 0;
        }
        else {
          local_210._M_current =
               (StringPiece *)
               std::vector<StringPiece,_std::allocator<StringPiece>_>::begin
                         ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
          while( true ) {
            m.i_ = std::vector<StringPiece,_std::allocator<StringPiece>_>::end
                             ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
            bVar2 = __gnu_cxx::operator!=(&local_210,&m.i_);
            if (!bVar2) break;
            local_228 = local_210._M_current;
            matches::matches(&local_220,(iterator)local_210._M_current);
            local_238._M_current =
                 (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                                    ((vector<Node_*,_std::allocator<Node_*>_> *)
                                     &path_local[1]._M_string_length);
            local_240 = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                           ((vector<Node_*,_std::allocator<Node_*>_> *)
                                            &path_local[1]._M_string_length);
            local_248 = local_220.i_._M_current;
            local_230 = std::
                        find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,matches>
                                  (local_238,
                                   (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                    )local_240,local_220);
            local_250._M_current =
                 (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                    ((vector<Node_*,_std::allocator<Node_*>_> *)
                                     &path_local[1]._M_string_length);
            bVar2 = __gnu_cxx::operator==(&local_230,&local_250);
            if (bVar2) {
              std::operator+(&local_2b0,err_local,": depfile mentions \'");
              pSVar6 = __gnu_cxx::
                       __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                       ::operator->(&local_210);
              StringPiece::AsString_abi_cxx11_(&local_2d0,pSVar6);
              std::operator+(&local_290,&local_2b0,&local_2d0);
              std::operator+(&local_270,&local_290,
                             "\' as an output, but no such output was declared");
              std::__cxx11::string::operator=((string *)local_30,(string *)&local_270);
              std::__cxx11::string::~string((string *)&local_270);
              std::__cxx11::string::~string((string *)&local_290);
              std::__cxx11::string::~string((string *)&local_2d0);
              std::__cxx11::string::~string((string *)&local_2b0);
              this_local._7_1_ = 0;
              goto LAB_00133a33;
            }
            __gnu_cxx::
            __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
            ::operator++(&local_210);
          }
          iVar3 = (**this->_vptr_ImplicitDepLoader)
                            (this,path_local,
                             &depfile.outs_.
                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,local_30);
          this_local._7_1_ = (byte)iVar3 & 1;
        }
      }
    }
    else {
      std::operator+(&local_1a0,err_local,": ");
      std::operator+(&local_180,&local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160)
      ;
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      this_local._7_1_ = 0;
    }
LAB_00133a33:
    depfile._52_4_ = 1;
    std::__cxx11::string::~string((string *)local_160);
    DepfileParser::~DepfileParser((DepfileParser *)local_138);
  }
  else {
    if ((g_explaining & 1U) != 0) {
      uVar8 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"ninja explain: depfile \'%s\' is missing\n",uVar8);
    }
    this_local._7_1_ = 0;
    depfile._52_4_ = 1;
  }
LAB_00133a67:
  std::__cxx11::string::~string((string *)local_98);
  ScopedMetric::~ScopedMetric((ScopedMetric *)((long)&content.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ImplicitDepLoader::LoadDepFile(Edge* edge, const string& path,
                                    string* err) {
  METRIC_RECORD("depfile load");
  // Read depfile content.  Treat a missing depfile as empty.
  string content;
  switch (disk_interface_->ReadFile(path, &content, err)) {
  case DiskInterface::Okay:
    break;
  case DiskInterface::NotFound:
    err->clear();
    break;
  case DiskInterface::OtherError:
    *err = "loading '" + path + "': " + *err;
    return false;
  }
  // On a missing depfile: return false and empty *err.
  if (content.empty()) {
    EXPLAIN("depfile '%s' is missing", path.c_str());
    return false;
  }

  DepfileParser depfile(depfile_parser_options_
                        ? *depfile_parser_options_
                        : DepfileParserOptions());
  string depfile_err;
  if (!depfile.Parse(&content, &depfile_err)) {
    *err = path + ": " + depfile_err;
    return false;
  }

  if (depfile.outs_.empty()) {
    *err = path + ": no outputs declared";
    return false;
  }

  uint64_t unused;
  std::vector<StringPiece>::iterator primary_out = depfile.outs_.begin();
  CanonicalizePath(const_cast<char*>(primary_out->str_), &primary_out->len_,
                   &unused);

  // Check that this depfile matches the edge's output, if not return false to
  // mark the edge as dirty.
  Node* first_output = edge->outputs_[0];
  StringPiece opath = StringPiece(first_output->path());
  if (opath != *primary_out) {
    EXPLAIN("expected depfile '%s' to mention '%s', got '%s'", path.c_str(),
            first_output->path().c_str(), primary_out->AsString().c_str());
    return false;
  }

  // Ensure that all mentioned outputs are outputs of the edge.
  for (std::vector<StringPiece>::iterator o = depfile.outs_.begin();
       o != depfile.outs_.end(); ++o) {
    matches m(o);
    if (std::find_if(edge->outputs_.begin(), edge->outputs_.end(), m) == edge->outputs_.end()) {
      *err = path + ": depfile mentions '" + o->AsString() + "' as an output, but no such output was declared";
      return false;
    }
  }

  return ProcessDepfileDeps(edge, &depfile.ins_, err);
}